

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O3

double __thiscall pbrt::SummedAreaTable::lookup(SummedAreaTable *this,int x,int y)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  double dVar6;
  
  dVar6 = 0.0;
  if (y != 0 && x != 0) {
    iVar1 = (this->sum).extent.pMin.super_Tuple2<pbrt::Point2,_int>.x;
    uVar2 = (this->sum).extent.pMin.super_Tuple2<pbrt::Point2,_int>.y;
    iVar4 = (this->sum).extent.pMax.super_Tuple2<pbrt::Point2,_int>.x - iVar1;
    iVar5 = iVar4 + -1;
    iVar3 = x + -1;
    if (iVar5 < x + -1) {
      iVar3 = iVar5;
    }
    iVar5 = ~uVar2 + (this->sum).extent.pMax.super_Tuple2<pbrt::Point2,_int>.y;
    if (y + -1 <= iVar5) {
      iVar5 = y + -1;
    }
    dVar6 = (this->sum).values[(int)((iVar5 - uVar2) * iVar4 + (iVar3 - iVar1))];
  }
  return dVar6;
}

Assistant:

PBRT_CPU_GPU
    double lookup(int x, int y) const {
        // Return zero at lower boundaries
        if (x == 0 || y == 0)
            return 0;

        // Reindex $(x,y)$ and return actual stored value
        x = std::min(x - 1, sum.xSize() - 1);
        y = std::min(y - 1, sum.ySize() - 1);
        return sum(x, y);
    }